

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O2

scanner * lightconf::config_format::make_scanner(scanner *__return_storage_ptr__,string *input)

{
  scanner_params sStack_38;
  
  scanner::scanner(__return_storage_ptr__);
  scanner_params::scanner_params(&sStack_38,(scanner_params *)default_scanner_params);
  scanner::scan(__return_storage_ptr__,input,&sStack_38);
  std::_Function_base::~_Function_base((_Function_base *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

inline scanner make_scanner(const std::string& input) {
    scanner sc;
    sc.scan(input);
    return sc;
}